

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase107::~TestCase107(TestCase107 *this)

{
  TestCase107 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == kj::none);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == kj::none);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != kj::none);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == kj::none);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == kj::none);
}